

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

MessageBuilder * __thiscall el::base::MessageBuilder::operator<<(MessageBuilder *this,wchar_t *msg)

{
  bool bVar1;
  stringstream_t *psVar2;
  Storage *this_00;
  long in_RSI;
  MessageBuilder *in_RDI;
  char *buff_;
  wchar_t *in_stack_ffffffffffffffe0;
  MessageBuilder *local_8;
  
  if (in_RSI == 0) {
    psVar2 = Logger::stream_abi_cxx11_(in_RDI->m_logger);
    std::operator<<((ostream *)(psVar2 + 0x10),consts::kNullPointer);
    local_8 = in_RDI;
  }
  else {
    this_00 = (Storage *)utils::Str::wcharPtrToCharPtr(in_stack_ffffffffffffffe0);
    psVar2 = Logger::stream_abi_cxx11_(in_RDI->m_logger);
    std::operator<<((ostream *)(psVar2 + 0x10),(char *)this_00);
    free(this_00);
    std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2335f1);
    bVar1 = Storage::hasFlag(this_00,(LoggingFlag)((ulong)in_RDI >> 0x20));
    local_8 = in_RDI;
    if (bVar1) {
      psVar2 = Logger::stream_abi_cxx11_(in_RDI->m_logger);
      std::operator<<((ostream *)(psVar2 + 0x10)," ");
      local_8 = in_RDI;
    }
  }
  return local_8;
}

Assistant:

MessageBuilder& MessageBuilder::operator<<(const wchar_t* msg) {
  if (msg == nullptr) {
    m_logger->stream() << base::consts::kNullPointer;
    return *this;
  }
#  if defined(ELPP_UNICODE)
  m_logger->stream() << msg;
#  else
  char* buff_ = base::utils::Str::wcharPtrToCharPtr(msg);
  m_logger->stream() << buff_;
  free(buff_);
#  endif
  if (ELPP->hasFlag(LoggingFlag::AutoSpacing)) {
    m_logger->stream() << " ";
  }
  return *this;
}